

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector3T.h
# Opt level: O2

ostream * CD_Matrix::operator<<(ostream *os,Vector3T<double,_false> *v)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<double>(v->m_x);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(v->m_y);
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(v->m_z);
  std::operator<<(poVar1," ");
  return os;
}

Assistant:

inline friend std::ostream & operator<<(std::ostream & os, Vector3T<T, normOptimization> const & v)
  {
    os << v.m_x << " " << v.m_y << " " << v.m_z << " ";
    return os;
  }